

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::ModuleHeaderSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if ((((kind == InterfaceHeader) || (kind == ModuleHeader)) || (kind == PackageHeader)) ||
     (kind == ProgramHeader)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ModuleHeaderSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::InterfaceHeader:
        case SyntaxKind::ModuleHeader:
        case SyntaxKind::PackageHeader:
        case SyntaxKind::ProgramHeader:
            return true;
        default:
            return false;
    }
}